

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O0

bool getOrTestValue(cmState *state,string *key,string *value,string *keyDescription,
                   string *errorMessage)

{
  bool bVar1;
  char *__s;
  ulong uVar2;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  byte local_62;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string cachedValue;
  char *entry;
  string *errorMessage_local;
  string *keyDescription_local;
  string *value_local;
  string *key_local;
  cmState *state_local;
  
  __s = cmState::GetCacheEntryValue(state,key);
  local_62 = 0;
  cachedValue.field_2._8_8_ = __s;
  if (__s == (char *)0x0) {
    std::__cxx11::string::string((string *)local_60);
  }
  else {
    std::allocator<char>::allocator();
    local_62 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_60,__s,&local_61);
  }
  if ((local_62 & 1) != 0) {
    std::allocator<char>::~allocator(&local_61);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::__cxx11::string::operator=((string *)value,(string *)local_60);
  }
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) &&
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_60,value), bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"\"",&local_119);
    std::operator+(&local_f8,&local_118,key);
    std::operator+(&local_d8,&local_f8,"\" is set but incompatible with configured ");
    std::operator+(&local_b8,&local_d8,keyDescription);
    std::operator+(&local_98,&local_b8," value.");
    setErrorMessage(errorMessage,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    state_local._7_1_ = false;
  }
  else {
    state_local._7_1_ = true;
  }
  std::__cxx11::string::~string((string *)local_60);
  return state_local._7_1_;
}

Assistant:

static bool getOrTestValue(cmState* state, const std::string& key,
                           std::string& value,
                           const std::string& keyDescription,
                           std::string* errorMessage)
{
  const char* entry = state->GetCacheEntryValue(key);
  const std::string cachedValue =
    entry == nullptr ? std::string() : std::string(entry);
  if (value.empty()) {
    value = cachedValue;
  }
  if (!cachedValue.empty() && cachedValue != value) {
    setErrorMessage(errorMessage,
                    std::string("\"") + key +
                      "\" is set but incompatible with configured " +
                      keyDescription + " value.");
    return false;
  }
  return true;
}